

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O1

Expression **
wasm::Properties::getImmediateFallthroughPtr
          (Expression **currp,PassOptions *passOptions,Module *module,FallthroughBehavior behavior)

{
  Id IVar1;
  LocalSet *this;
  uintptr_t uVar2;
  Expression *a;
  Expression *b;
  long lVar3;
  uint uVar4;
  LocalSet *pLVar5;
  undefined7 extraout_var;
  LocalSet *extraout_RAX;
  Expression **ppEVar6;
  bool bVar7;
  EffectAnalyzer local_190;
  
  this = (LocalSet *)*currp;
  if ((this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id == 1) {
    return currp;
  }
  IVar1 = (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id;
  uVar4 = (uint)IVar1;
  if (IVar1 < TryId) {
    if (8 < uVar4 - 1) {
switchD_0070aeb4_caseD_5:
      pLVar5 = (LocalSet *)0x0;
      if (IVar1 == BrOnId) {
        pLVar5 = this;
      }
      bVar7 = pLVar5 == (LocalSet *)0x0;
      pLVar5 = (LocalSet *)
               &pLVar5[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression.type;
LAB_0070affb:
      if (bVar7) {
LAB_0070afff:
        bVar7 = true;
      }
      else {
        bVar7 = false;
      }
      goto LAB_0070b005;
    }
    pLVar5 = (LocalSet *)
             ((long)&switchD_0070aeb4::switchdataD_00dcfa90 +
             (long)(int)(&switchD_0070aeb4::switchdataD_00dcfa90)[uVar4 - 1]);
    switch(uVar4) {
    case 1:
      if (this->value == (Expression *)0x0) {
        uVar2 = this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression.type.id;
        if (uVar2 != 0) {
          return (Expression **)
                 (*(long *)&this[1].super_SpecificExpression<(wasm::Expression::Id)9>.
                            super_Expression + uVar2 * 8 + -8);
        }
        return currp;
      }
      break;
    case 2:
      lVar3 = *(long *)&this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression;
      if (lVar3 != 0) {
        if ((this->value->type).id == 1) goto switchD_0070aeb4_caseD_3;
        if (*(long *)(lVar3 + 8) == 1) {
          return &this->value;
        }
      }
      break;
    case 3:
switchD_0070aeb4_caseD_3:
      return (Expression **)(this + 1);
    case 4:
      a = (Expression *)
          this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression.type.id;
      if (a == (Expression *)0x0) goto LAB_0070b009;
      b = *(Expression **)
           &this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression;
      pLVar5 = (LocalSet *)CONCAT71((int7)((ulong)pLVar5 >> 8),b == (Expression *)0x0);
      if (behavior != AllowTeeBrIf || b == (Expression *)0x0) goto LAB_0070b009;
      bVar7 = EffectAnalyzer::canReorder(passOptions,module,a,b);
      pLVar5 = (LocalSet *)CONCAT71(extraout_var,bVar7);
      if (!bVar7) goto LAB_0070b009;
      pLVar5 = this + 1;
      bVar7 = false;
      goto LAB_0070b00f;
    default:
      goto switchD_0070aeb4_caseD_5;
    case 9:
      bVar7 = LocalSet::isTee(this);
      ppEVar6 = &this->value;
      if (!bVar7) {
        ppEVar6 = currp;
      }
      if (behavior != AllowTeeBrIf) {
        return currp;
      }
      return ppEVar6;
    }
  }
  else {
    if (IVar1 != TryId) {
      if (uVar4 == 0x3f) {
        pLVar5 = (LocalSet *)&this->index;
        bVar7 = false;
      }
      else {
        if (uVar4 != 0x51) goto switchD_0070aeb4_caseD_5;
        bVar7 = this->index - 1 < 2;
        pLVar5 = (LocalSet *)&this->value;
      }
      goto LAB_0070affb;
    }
    EffectAnalyzer::EffectAnalyzer
              (&local_190,passOptions,module,
               *(Expression **)
                &this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression);
    EffectAnalyzer::~EffectAnalyzer(&local_190);
    pLVar5 = extraout_RAX;
    if ((local_190.throws_ != false) ||
       (local_190.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))
    goto LAB_0070afff;
    pLVar5 = this + 1;
    bVar7 = false;
LAB_0070b005:
    if (bVar7) {
LAB_0070b009:
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
LAB_0070b00f:
    if (!bVar7) {
      return (Expression **)pLVar5;
    }
  }
  return currp;
}

Assistant:

inline Expression** getImmediateFallthroughPtr(
  Expression** currp,
  const PassOptions& passOptions,
  Module& module,
  FallthroughBehavior behavior = FallthroughBehavior::AllowTeeBrIf) {
  auto* curr = *currp;
  // If the current node is unreachable, there is no value
  // falling through.
  if (curr->type == Type::unreachable) {
    return currp;
  }
  if (auto* set = curr->dynCast<LocalSet>()) {
    if (set->isTee() && behavior == FallthroughBehavior::AllowTeeBrIf) {
      return &set->value;
    }
  } else if (auto* block = curr->dynCast<Block>()) {
    // if no name, we can't be broken to, and then can look at the fallthrough
    if (!block->name.is() && block->list.size() > 0) {
      return &block->list.back();
    }
  } else if (auto* loop = curr->dynCast<Loop>()) {
    return &loop->body;
  } else if (auto* iff = curr->dynCast<If>()) {
    if (iff->ifFalse) {
      // Perhaps just one of the two actually returns.
      if (iff->ifTrue->type == Type::unreachable) {
        return &iff->ifFalse;
      } else if (iff->ifFalse->type == Type::unreachable) {
        return &iff->ifTrue;
      }
    }
  } else if (auto* br = curr->dynCast<Break>()) {
    // Note that we must check for the ability to reorder the condition and the
    // value, as the value is first, which would be a problem here:
    //
    //  (br_if ..
    //    (local.get $x)    ;; value
    //    (tee_local $x ..) ;; condition
    //  )
    //
    // We must not say that the fallthrough value is $x, since it is the
    // *earlier* value of $x before the tee that is passed out. But, if we can
    // reorder then that means that the value could have been last and so we do
    // know the fallthrough in that case.
    if (br->condition && br->value &&
        behavior == FallthroughBehavior::AllowTeeBrIf &&
        EffectAnalyzer::canReorder(
          passOptions, module, br->condition, br->value)) {
      return &br->value;
    }
  } else if (auto* tryy = curr->dynCast<Try>()) {
    if (!EffectAnalyzer(passOptions, module, tryy->body).throws()) {
      return &tryy->body;
    }
  } else if (auto* as = curr->dynCast<RefCast>()) {
    return &as->ref;
  } else if (auto* as = curr->dynCast<RefAs>()) {
    // Extern conversions are not casts and actually produce new values.
    // Treating them as fallthroughs would lead to misoptimizations of
    // subsequent casts.
    if (as->op != AnyConvertExtern && as->op != ExternConvertAny) {
      return &as->value;
    }
  } else if (auto* br = curr->dynCast<BrOn>()) {
    return &br->ref;
  }
  return currp;
}